

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse_config(App *this,vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *args)

{
  bool bVar1;
  ConfigError *__return_storage_ptr__;
  string local_58;
  reference local_38;
  ConfigItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__range1;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *args_local;
  App *this_local;
  
  __end1 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::begin(args);
  item = (ConfigItem *)std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end(args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                *)&item);
    if (!bVar1) {
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
               ::operator*(&__end1);
    bVar1 = _parse_single_config(this,local_38,0);
    if ((!bVar1) && (this->allow_config_extras_ == error)) break;
    __gnu_cxx::
    __normal_iterator<const_CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
    ::operator++(&__end1);
  }
  __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
  ConfigItem::fullname_abi_cxx11_(&local_58,local_38);
  ConfigError::Extras(__return_storage_ptr__,&local_58);
  __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

CLI11_INLINE void App::_parse_config(const std::vector<ConfigItem> &args) {
    for(const ConfigItem &item : args) {
        if(!_parse_single_config(item) && allow_config_extras_ == config_extras_mode::error)
            throw ConfigError::Extras(item.fullname());
    }
}